

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::emptydashbuffer(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  _Rb_tree_node_base *p_Var1;
  
  requireDStackAvailable(this,1,"EMPTY-BUFFERS");
  this_00 = &this->dStack;
  ForthStack<unsigned_int>::push(this_00,0);
  for (p_Var1 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    ForthStack<unsigned_int>::setTop(this_00,*(uint *)&p_Var1[1]._M_parent);
    memFree(this);
  }
  ForthStack<unsigned_int>::pop(this_00);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>,_std::_Select1st<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
  ::clear(&(this->blocksInProcess)._M_t);
  return;
}

Assistant:

void emptydashbuffer(){
			REQUIRE_DSTACK_AVAILABLE(1, "EMPTY-BUFFERS");
			dStack.push(0);
			for (auto& block : blocksInProcess) {
				dStack.setTop(block.second.blockLocation);
				memFree();
				// we do not check error (if buffer was freed by other part of program)
			}
			dStack.pop();
			blocksInProcess.clear();
		}